

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lambda.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Task *pTVar8;
  undefined4 uVar9;
  SingleFunctor SVar10;
  int iVar11;
  ostream *poVar12;
  Workitem *pWVar13;
  Task *pTVar14;
  void *pvVar15;
  char *pcVar16;
  char *pcVar17;
  X y;
  X x;
  code *local_98;
  undefined8 local_90;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  SingleFunctor sf1;
  undefined4 uStack_64;
  arg_info *pargs;
  undefined8 uStack_50;
  code *local_48;
  code *local_40;
  
  poVar12 = std::operator<<((ostream *)&std::cout,"Using ");
  iVar11 = depspawn::get_num_threads();
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar11);
  std::operator<<(poVar12," threads\n");
  local_98 = (code *)CONCAT44(local_98._4_4_,99);
  pargs = (arg_info *)0x0;
  local_88._0_4_ =
       depspawn::internal::
       fill_args<boost::mpl::v_iter<boost::function_types::parameter_types<void(int&,int_const&),boost::add_reference<mpl_::arg<_1>>>,0l>,int&,int>
                 (&pargs,&tmpresult,(int *)&local_98);
  if ((depspawn::internal::TP == (Task *)0x0) ||
     (*(char *)&depspawn::internal::TP[10].next == '\x01')) {
    depspawn::internal::start_master();
  }
  pWVar13 = LinkedListPool<depspawn::internal::Workitem,true,false>::
            malloc<depspawn::internal::arg_info*&,int_const&>
                      ((LinkedListPool<depspawn::internal::Workitem,true,false> *)
                       depspawn::internal::Workitem::Pool,&pargs,(int *)local_88._M_pod_data);
  pTVar8 = depspawn::internal::TP;
  uVar9 = local_98._0_4_;
  pTVar14 = LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::intl_malloc
                      ((LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *)
                       &depspawn::internal::TP[9].next);
  *(undefined8 *)&(pTVar14->func_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(pTVar14->func_).super__Function_base._M_functor + 8) = 0;
  (pTVar14->func_).super__Function_base._M_manager = (_Manager_type)0x0;
  (pTVar14->func_)._M_invoker = (_Invoker_type)0x0;
  pvVar15 = operator_new(0x18);
  *(undefined4 *)((long)pvVar15 + 8) = uVar9;
  *(int **)((long)pvVar15 + 0x10) = &tmpresult;
  *(void **)&(pTVar14->func_).super__Function_base._M_functor = pvVar15;
  (pTVar14->func_)._M_invoker =
       std::
       _Function_handler<void_(),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fraguela[P]depspawn/tests/test_lambda.cpp:80:9)_(std::reference_wrapper<int>,_int)>_>
       ::_M_invoke;
  (pTVar14->func_).super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fraguela[P]depspawn/tests/test_lambda.cpp:80:9)_(std::reference_wrapper<int>,_int)>_>
       ::_M_manager;
  pTVar14->ctx_ = pWVar13;
  pTVar14->next = pTVar8;
  depspawn::internal::Workitem::insert_in_worklist(pWVar13,pTVar14);
  pargs = (arg_info *)0x0;
  local_88._0_4_ =
       depspawn::internal::
       fill_args<boost::mpl::v_iter<boost::function_types::parameter_types<void(int&,int_const&),boost::add_reference<mpl_::arg<_1>>>,0l>,int&,int&>
                 (&pargs,&i,&tmpresult);
  if ((depspawn::internal::TP == (Task *)0x0) ||
     (*(char *)&depspawn::internal::TP[10].next == '\x01')) {
    depspawn::internal::start_master();
  }
  pWVar13 = LinkedListPool<depspawn::internal::Workitem,true,false>::
            malloc<depspawn::internal::arg_info*&,int_const&>
                      ((LinkedListPool<depspawn::internal::Workitem,true,false> *)
                       depspawn::internal::Workitem::Pool,&pargs,(int *)local_88._M_pod_data);
  pTVar8 = depspawn::internal::TP;
  pTVar14 = LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::intl_malloc
                      ((LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *)
                       &depspawn::internal::TP[9].next);
  *(undefined8 *)&(pTVar14->func_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(pTVar14->func_).super__Function_base._M_functor + 8) = 0;
  (pTVar14->func_).super__Function_base._M_manager = (_Manager_type)0x0;
  (pTVar14->func_)._M_invoker = (_Invoker_type)0x0;
  pvVar15 = operator_new(0x18);
  *(int **)((long)pvVar15 + 8) = &tmpresult;
  *(int **)((long)pvVar15 + 0x10) = &i;
  *(void **)&(pTVar14->func_).super__Function_base._M_functor = pvVar15;
  (pTVar14->func_)._M_invoker =
       std::
       _Function_handler<void_(),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fraguela[P]depspawn/tests/test_lambda.cpp:82:9)_(std::reference_wrapper<int>,_std::reference_wrapper<int>)>_>
       ::_M_invoke;
  (pTVar14->func_).super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fraguela[P]depspawn/tests/test_lambda.cpp:82:9)_(std::reference_wrapper<int>,_std::reference_wrapper<int>)>_>
       ::_M_manager;
  pTVar14->ctx_ = pWVar13;
  pTVar14->next = pTVar8;
  depspawn::internal::Workitem::insert_in_worklist(pWVar13,pTVar14);
  depspawn::wait_for_all();
  iVar6 = tmpresult;
  iVar11 = i;
  poVar12 = std::operator<<((ostream *)&std::cout,"LAMBDA TEST ");
  pcVar16 = "SUCCESSFUL";
  pcVar17 = "SUCCESSFUL";
  if (iVar11 != 200 || iVar6 != 100) {
    pcVar17 = "UNSUCCESSFUL";
  }
  poVar12 = std::operator<<(poVar12,pcVar17);
  std::endl<char,std::char_traits<char>>(poVar12);
  x.v_ = 10;
  uStack_50 = 0;
  pargs = (arg_info *)0xa;
  local_40 = std::_Function_handler<void_(int_&),_X>::_M_invoke;
  local_48 = std::_Function_handler<void_(int_&),_X>::_M_manager;
  local_88._8_8_ = 0;
  local_88._M_unused._M_member_pointer = 10;
  local_70 = std::_Function_handler<void_(int_&,_int),_X>::_M_invoke;
  local_78 = std::_Function_handler<void_(int_&,_int),_X>::_M_manager;
  depspawn::spawn<std::function<void(int&)>,int&>((function<void_(int_&)> *)&pargs,&i);
  depspawn::spawn<std::function<void(int&)>,int&>((function<void_(int_&)> *)&pargs,&tmpresult);
  depspawn::spawn<std::function<void(int&,int)>,int&,int&>
            ((function<void_(int_&,_int)> *)&local_88,&i,&tmpresult);
  depspawn::wait_for_all();
  bVar1 = i != 0x14a;
  bVar2 = tmpresult != 0x6e;
  poVar12 = std::operator<<((ostream *)&std::cout,"STD::FUNCTION TEST ");
  pcVar17 = "SUCCESSFUL";
  if (bVar1 || bVar2) {
    pcVar17 = "UNSUCCESSFUL";
  }
  poVar12 = std::operator<<(poVar12,pcVar17);
  std::endl<char,std::char_traits<char>>(poVar12);
  y.v_ = 5;
  local_98 = X::sub;
  local_90 = 0;
  _sf1 = X::sub;
  depspawn::spawn<void(X::*)(int&)const,X&,int&>((offset_in_X_to_subr *)&sf1,&x,&i);
  depspawn::spawn<void(X::*)(int&)const,X_const&,int&>
            ((offset_in_X_to_subr *)&local_98,&y,&tmpresult);
  local_98 = X::operator();
  local_90 = 0;
  depspawn::spawn<void(X::*)(int&)const,X_const&,int&>((offset_in_X_to_subr *)&local_98,&y,&i);
  depspawn::wait_for_all();
  bVar3 = i != 0x145;
  bVar4 = tmpresult != 0x69;
  poVar12 = std::operator<<((ostream *)&std::cout,"PTR TO MEMBER FUNCTION TEST ");
  pcVar17 = "SUCCESSFUL";
  if (bVar3 || bVar4) {
    pcVar17 = "UNSUCCESSFUL";
  }
  poVar12 = std::operator<<(poVar12,pcVar17);
  std::endl<char,std::char_traits<char>>(poVar12);
  _sf1 = (code *)CONCAT44(uStack_64,100);
  depspawn::spawn<SingleFunctor&,int&>(&sf1,&i);
  depspawn::spawn<SingleFunctor&,int&>(&sf1,&tmpresult);
  depspawn::spawn<SingleFunctor&,int&>(&sf1,&i);
  depspawn::wait_for_all();
  iVar7 = tmpresult;
  iVar5 = i;
  SVar10.v_ = sf1.v_;
  poVar12 = std::operator<<((ostream *)&std::cout,"FUNCTOR TEST ");
  if (SVar10.v_ != 0x358 || (iVar5 != 0x147 || iVar7 != 0x6a)) {
    pcVar16 = "UNSUCCESSFUL";
  }
  poVar12 = std::operator<<(poVar12,pcVar16);
  std::endl<char,std::char_traits<char>>(poVar12);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  std::_Function_base::~_Function_base((_Function_base *)&pargs);
  return (uint)(((iVar11 != 200 || iVar6 != 100) || (bVar1 || bVar2)) || (bVar3 || bVar4));
}

Assistant:

int main()
{
  std::cout << "Using " << get_num_threads() << " threads\n";

  spawn([](int &r, const int& i) { r = i + 1; LOG("setting " << r); }, tmpresult, 99);
  
  spawn([](int &r, const int& i) { r = 2 * i; LOG("setting " << r); }, i, tmpresult);
  
  wait_for_all();

  const bool test_ok1 = (tmpresult == 100) && (i == 200);
  std::cout << "LAMBDA TEST " << (test_ok1 ? "SUCCESSFUL" : "UNSUCCESSFUL") << std::endl;
  
  X x(10);
  
  std::function<void(int&)> f = x;
  std::function<void(int&, int)> g = x;
  
  spawn(f, i);            // i = 200 + 10 = 210
  spawn(f, tmpresult);    // tmpresult = 100 + 10 = 110
  spawn(g, i, tmpresult); // i = 210 + 10 + 110 = 330
  
  wait_for_all();
  
  const bool test_ok2 = (tmpresult == 110) && (i == 330);
  std::cout << "STD::FUNCTION TEST " << (test_ok2 ? "SUCCESSFUL" : "UNSUCCESSFUL") << std::endl;
  
  const X y(5);
  
  void (X::*ptrmem)(int&) const;
  ptrmem = &X::sub;
  
  spawn(&X::sub, x, i);          // i = 330 - 10 = 320
  spawn(ptrmem, y, tmpresult);   // tmpresult = 110 - 5 = 105
  ptrmem = &X::operator();
  spawn(ptrmem, y, i);           // i = 320 + 5 = 325;
  
  wait_for_all();
  
  const bool test_ok3 = (tmpresult == 105) && (i == 325);
  std::cout << "PTR TO MEMBER FUNCTION TEST " << (test_ok3 ? "SUCCESSFUL" : "UNSUCCESSFUL") << std::endl;
  
  SingleFunctor sf1(100);
  spawn(sf1, i);         //sf1.v_ = 100 + 325 = 425;  i++= 326
  spawn(sf1, tmpresult); //sf1.v_ = 425 + 105 = 530;  tmpresult++= 106
  spawn(sf1, i);         //sf1.v_ = 530 + 326 = 856;  i++= 327
  wait_for_all();
  
  const bool test_ok4 = (tmpresult == 106) && (i == 327) && (sf1.value() == 856);
  std::cout << "FUNCTOR TEST " << (test_ok4 ? "SUCCESSFUL" : "UNSUCCESSFUL") << std::endl;
  
  return !(test_ok1 && test_ok2 && test_ok3);
}